

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O3

UniValue *
MempoolToJSON(UniValue *__return_storage_ptr__,CTxMemPool *pool,bool verbose,
             bool include_mempool_sequence)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CTxMemPoolEntry *e;
  string key;
  string key_00;
  string key_01;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  mutex_type *pmVar2;
  UniValue *__return_storage_ptr___00;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  _Alloc_hider _Var3;
  long in_FS_OFFSET;
  uint64_t mempool_sequence;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock8;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock9;
  UniValue info;
  UniValue *in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffcd4;
  undefined4 uVar5;
  CTxMemPool *in_stack_fffffffffffffcd8;
  unsigned_long in_stack_fffffffffffffce0;
  uint64_t uVar6;
  mutex_type *in_stack_fffffffffffffce8;
  RecursiveMutex *pRVar7;
  mutex_type *pmVar8;
  bool in_stack_fffffffffffffcf0;
  bool bVar9;
  undefined7 in_stack_fffffffffffffcf1;
  pointer in_stack_fffffffffffffcf8;
  mutex_type *in_stack_fffffffffffffd00;
  bool in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd09 [15];
  _Alloc_hider in_stack_fffffffffffffd18;
  size_type in_stack_fffffffffffffd20;
  undefined8 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd30 [16];
  vector<UniValue,_std::allocator<UniValue>_> local_2b0;
  pointer local_298 [2];
  pointer local_288 [2];
  VType local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_270;
  size_type local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_250;
  vector<UniValue,_std::allocator<UniValue>_> local_238;
  long *local_220 [2];
  long local_210 [2];
  undefined1 *local_200;
  undefined8 local_1f8;
  undefined1 local_1f0;
  undefined8 local_1ef;
  undefined4 local_1e7;
  undefined2 local_1e3;
  char local_1e1;
  string local_1e0;
  UniValue local_1c0;
  undefined1 *local_168;
  undefined8 local_160;
  undefined1 local_158 [9];
  undefined4 local_14f;
  undefined2 local_14b;
  char local_149;
  VType local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  size_type local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  vector<UniValue,_std::allocator<UniValue>_> local_108;
  string local_f0;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  undefined8 uStack_b8;
  undefined1 local_b0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  vector<UniValue,_std::allocator<UniValue>_> vStack_70;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined8 local_47;
  undefined4 local_3f;
  undefined2 local_3b;
  char local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000011,verbose) == 0) {
    local_168 = local_158;
    local_b0._8_8_ = &local_98;
    local_b0._0_4_ = 2;
    local_98._M_local_buf[0] = '\0';
    local_98._M_allocated_capacity._1_7_ = (undefined7)local_158._1_8_;
    local_98._M_local_buf[8] = SUB81(local_158._1_8_,7);
    local_98._9_4_ = local_14f;
    local_98._13_2_ = local_14b;
    local_98._M_local_buf[0xf] = local_149;
    local_b0._16_8_ = 0;
    local_160 = 0;
    local_158[0] = 0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_70.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_70.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_70.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar7 = &pool->cs;
    bVar9 = false;
    std::unique_lock<std::recursive_mutex>::lock
              ((unique_lock<std::recursive_mutex> *)&stack0xfffffffffffffd00);
    CTxMemPool::entryAll
              ((vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                *)&stack0xfffffffffffffce8,pool);
    pmVar2 = (mutex_type *)CONCAT71(in_stack_fffffffffffffcf1,in_stack_fffffffffffffcf0);
    pmVar8 = in_stack_fffffffffffffce8;
    if (in_stack_fffffffffffffce8 != pmVar2) {
      in_stack_fffffffffffffcd0 =
           (undefined4)CONCAT71(in_register_00000009,include_mempool_sequence);
      do {
        base_blob<256u>::ToString_abi_cxx11_
                  (&local_1e0,
                   (void *)(**(long **)&(in_stack_fffffffffffffce8->super___recursive_mutex_base).
                                        _M_mutex + 0x39));
        UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_1c0,&local_1e0);
        val.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffcd0;
        val._0_8_ = __return_storage_ptr__;
        val.val._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffcd4;
        val.val._M_string_length = (size_type)pool;
        val.val.field_2._M_allocated_capacity = in_stack_fffffffffffffce0;
        val.val.field_2._8_8_ = pmVar8;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_1_ = in_stack_fffffffffffffcf0;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._1_7_ = in_stack_fffffffffffffcf1;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffcf8;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pRVar7;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = bVar9;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._1_15_ = in_stack_fffffffffffffd09;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffd18._M_p;
        UniValue::push_back((UniValue *)local_b0,val);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1c0.values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1c0.keys);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0.val._M_dataplus._M_p != &local_1c0.val.field_2) {
          operator_delete(local_1c0.val._M_dataplus._M_p,
                          local_1c0.val.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        in_stack_fffffffffffffce8 =
             (mutex_type *)
             ((long)&(in_stack_fffffffffffffce8->super___recursive_mutex_base)._M_mutex + 8);
      } while (in_stack_fffffffffffffce8 != pmVar2);
      include_mempool_sequence = SUB41(in_stack_fffffffffffffcd0,0);
      in_stack_fffffffffffffcc8 = __return_storage_ptr__;
      in_stack_fffffffffffffcd8 = pool;
    }
    if (pmVar8 != (mutex_type *)0x0) {
      operator_delete(pmVar8,(long)in_stack_fffffffffffffcf8 - (long)pmVar8);
    }
    uVar6 = pool->m_sequence_number;
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&stack0xfffffffffffffd00);
    if (include_mempool_sequence == false) {
      __return_storage_ptr__->typ = local_b0._0_4_;
      paVar1 = &(__return_storage_ptr__->val).field_2;
      (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._8_8_ == &local_98) {
        paVar1->_M_allocated_capacity =
             CONCAT71(local_98._M_allocated_capacity._1_7_,local_98._M_local_buf[0]);
        *(ulong *)((long)&(__return_storage_ptr__->val).field_2 + 8) =
             CONCAT17(local_98._M_local_buf[0xf],
                      CONCAT25(local_98._13_2_,CONCAT41(local_98._9_4_,local_98._M_local_buf[8])));
      }
      else {
        (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)local_b0._8_8_;
        (__return_storage_ptr__->val).field_2._M_allocated_capacity =
             CONCAT71(local_98._M_allocated_capacity._1_7_,local_98._M_local_buf[0]);
      }
      (__return_storage_ptr__->val)._M_string_length = local_b0._16_8_;
      local_b0._16_8_ = 0;
      local_98._M_local_buf[0] = '\0';
      (__return_storage_ptr__->keys).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_88.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->keys).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_88.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->keys).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_88.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
      _M_impl.super__Vector_impl_data._M_start =
           vStack_70.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           vStack_70.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           vStack_70.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      vStack_70.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vStack_70.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_70.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b0._8_8_ = &local_98;
    }
    else {
      local_200 = &local_1f0;
      __return_storage_ptr__->typ = VOBJ;
      (__return_storage_ptr__->val)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->val).field_2;
      (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
      *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_1ef;
      *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_1e7;
      *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_1e3;
      (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_1e1;
      (__return_storage_ptr__->val)._M_string_length = 0;
      local_1f8 = 0;
      local_1f0 = 0;
      (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->keys).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->keys).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->keys).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_220[0] = local_210;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"txids","");
      local_278 = local_b0._0_4_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._8_8_ == &local_98) {
        local_260._8_8_ =
             CONCAT17(local_98._M_local_buf[0xf],
                      CONCAT25(local_98._13_2_,CONCAT41(local_98._9_4_,local_98._M_local_buf[8])));
        local_270 = &local_260;
      }
      else {
        local_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b0._8_8_;
      }
      local_260._M_allocated_capacity._1_7_ = local_98._M_allocated_capacity._1_7_;
      local_260._M_local_buf[0] = local_98._M_local_buf[0];
      local_268 = local_b0._16_8_;
      local_b0._16_8_ = 0;
      local_98._M_local_buf[0] = '\0';
      local_250.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_88.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_250.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_88.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_250.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_88.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start =
           vStack_70.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_238.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish =
           vStack_70.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_238.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           vStack_70.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      vStack_70.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vStack_70.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_70.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      key_00._M_string_length._0_4_ = in_stack_fffffffffffffcd0;
      key_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffcc8;
      key_00._M_string_length._4_4_ = in_stack_fffffffffffffcd4;
      key_00.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffcd8;
      key_00.field_2._8_8_ = uVar6;
      val_01.val._M_dataplus._M_p._0_1_ = in_stack_fffffffffffffcf0;
      val_01._0_8_ = pmVar8;
      val_01.val._M_dataplus._M_p._1_7_ = in_stack_fffffffffffffcf1;
      val_01.val._M_string_length = (size_type)in_stack_fffffffffffffcf8;
      val_01.val.field_2._M_allocated_capacity = (size_type)pRVar7;
      val_01.val.field_2._M_local_buf[8] = bVar9;
      val_01._33_15_ = in_stack_fffffffffffffd09;
      val_01.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd18._M_p;
      val_01.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffd20;
      val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffd28;
      val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd30._0_8_;
      val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffd30._8_8_;
      local_b0._8_8_ = &local_98;
      UniValue::pushKV(__return_storage_ptr__,key_00,val_01);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_238);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_250);
      if (local_270 != &local_260) {
        operator_delete(local_270,local_260._M_allocated_capacity + 1);
      }
      if (local_220[0] != local_210) {
        operator_delete(local_220[0],local_210[0] + 1);
      }
      local_298[0] = (pointer)local_288;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"mempool_sequence","");
      UniValue::UniValue<unsigned_long_&,_unsigned_long,_true>
                ((UniValue *)&stack0xfffffffffffffd10,(unsigned_long *)&stack0xfffffffffffffce0);
      key_01._M_string_length._0_4_ = in_stack_fffffffffffffcd0;
      key_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffcc8;
      key_01._M_string_length._4_4_ = in_stack_fffffffffffffcd4;
      key_01.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffcd8;
      key_01.field_2._8_8_ = uVar6;
      val_02.val._M_dataplus._M_p._0_1_ = in_stack_fffffffffffffcf0;
      val_02._0_8_ = pmVar8;
      val_02.val._M_dataplus._M_p._1_7_ = in_stack_fffffffffffffcf1;
      val_02.val._M_string_length = (size_type)in_stack_fffffffffffffcf8;
      val_02.val.field_2._M_allocated_capacity = (size_type)pRVar7;
      val_02.val.field_2._M_local_buf[8] = bVar9;
      val_02._33_15_ = in_stack_fffffffffffffd09;
      val_02.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd18._M_p;
      val_02.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffd20;
      val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffd28;
      val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd30._0_8_;
      val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffd30._8_8_;
      UniValue::pushKV(__return_storage_ptr__,key_01,val_02);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_2b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xfffffffffffffd38);
      if ((pointer)in_stack_fffffffffffffd18._M_p != (pointer)&stack0xfffffffffffffd28) {
        operator_delete(in_stack_fffffffffffffd18._M_p,in_stack_fffffffffffffd28 + 1);
      }
      if (local_298[0] != (pointer)local_288) {
        operator_delete(local_298[0],(ulong)((long)&local_288[0]->typ + 1));
      }
    }
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_70);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._8_8_ != &local_98) {
      operator_delete((void *)local_b0._8_8_,
                      CONCAT71(local_98._M_allocated_capacity._1_7_,local_98._M_local_buf[0]) + 1);
    }
  }
  else {
    if (include_mempool_sequence) {
      __return_storage_ptr___00 = (UniValue *)__cxa_allocate_exception(0x58);
      local_b0._0_8_ = local_b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b0,"Verbose results cannot contain mempool sequence values.","");
      JSONRPCError(__return_storage_ptr___00,-8,(string *)local_b0);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(__return_storage_ptr___00,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_002f168d;
    }
    pRVar7 = &pool->cs;
    bVar9 = false;
    std::unique_lock<std::recursive_mutex>::lock
              ((unique_lock<std::recursive_mutex> *)&stack0xfffffffffffffce8);
    local_58 = &local_48;
    __return_storage_ptr__->typ = VOBJ;
    (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2
    ;
    (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
    *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_47;
    *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_3f;
    *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_3b;
    (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_39;
    (__return_storage_ptr__->val)._M_string_length = 0;
    local_50 = 0;
    local_48 = 0;
    (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->keys).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->keys).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->keys).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    CTxMemPool::entryAll
              ((vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                *)&local_1e0,pool);
    uVar4 = (undefined4)local_1e0._M_string_length;
    uVar5 = (undefined4)(local_1e0._M_string_length >> 0x20);
    if (local_1e0._M_dataplus._M_p != (pointer)local_1e0._M_string_length) {
      _Var3._M_p = local_1e0._M_dataplus._M_p;
      do {
        e = *(CTxMemPoolEntry **)_Var3._M_p;
        local_b0._0_4_ = 1;
        local_d0 = &local_c0;
        local_98._M_local_buf[0] = '\0';
        local_98._M_allocated_capacity._1_7_ = uStack_bf;
        local_98._M_local_buf[8] = (char)uStack_b8;
        local_98._9_4_ = (undefined4)((ulong)uStack_b8 >> 8);
        local_98._13_2_ = (undefined2)((ulong)uStack_b8 >> 0x28);
        local_98._M_local_buf[0xf] = (char)((ulong)uStack_b8 >> 0x38);
        local_b0._16_8_ = 0;
        local_c8 = 0;
        local_c0 = 0;
        vStack_70.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_70.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_70.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b0._8_8_ = &local_98;
        entryToJSON(pool,(UniValue *)local_b0,e);
        base_blob<256u>::ToString_abi_cxx11_
                  (&local_f0,
                   &((e->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash);
        local_148 = local_b0._0_4_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._8_8_ == &local_98) {
          local_130._8_8_ =
               CONCAT17(local_98._M_local_buf[0xf],
                        CONCAT25(local_98._13_2_,CONCAT41(local_98._9_4_,local_98._M_local_buf[8])))
          ;
          local_140 = &local_130;
        }
        else {
          local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b0._8_8_;
        }
        local_130._M_allocated_capacity._1_7_ = local_98._M_allocated_capacity._1_7_;
        local_130._M_local_buf[0] = local_98._M_local_buf[0];
        local_138 = local_b0._16_8_;
        local_b0._16_8_ = 0;
        local_98._M_local_buf[0] = '\0';
        local_120.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_88.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_120.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_88.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_120.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_88.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_108.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start =
             vStack_70.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_108.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish =
             vStack_70.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_108.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             vStack_70.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        vStack_70.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_70.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        vStack_70.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        key._M_string_length._0_4_ = uVar4;
        key._M_dataplus._M_p = (pointer)__return_storage_ptr__;
        key._M_string_length._4_4_ = uVar5;
        key.field_2._M_allocated_capacity = (size_type)pool;
        key.field_2._8_8_ = in_stack_fffffffffffffce0;
        val_00.val._M_dataplus._M_p._0_1_ = bVar9;
        val_00._0_8_ = pRVar7;
        val_00.val._M_dataplus._M_p._1_7_ = in_stack_fffffffffffffcf1;
        val_00.val._M_string_length = (size_type)in_stack_fffffffffffffcf8;
        val_00.val.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffd00;
        val_00.val.field_2._M_local_buf[8] = in_stack_fffffffffffffd08;
        val_00._33_15_ = in_stack_fffffffffffffd09;
        val_00.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd18._M_p;
        val_00.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffd20;
        val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffd28;
        val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd30._0_8_;
        val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffd30._8_8_;
        local_b0._8_8_ = &local_98;
        UniValue::pushKVEnd(__return_storage_ptr__,key,val_00);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_108);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_120);
        if (local_140 != &local_130) {
          operator_delete(local_140,local_130._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_70);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._8_8_ != &local_98) {
          operator_delete((void *)local_b0._8_8_,
                          CONCAT71(local_98._M_allocated_capacity._1_7_,local_98._M_local_buf[0]) +
                          1);
        }
        _Var3._M_p = _Var3._M_p + 8;
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)_Var3._M_p !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)CONCAT44(uVar5,uVar4));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_1e0._M_dataplus._M_p,
                      local_1e0.field_2._M_allocated_capacity - (long)local_1e0._M_dataplus._M_p);
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&stack0xfffffffffffffce8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_002f168d:
  __stack_chk_fail();
}

Assistant:

UniValue MempoolToJSON(const CTxMemPool& pool, bool verbose, bool include_mempool_sequence)
{
    if (verbose) {
        if (include_mempool_sequence) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Verbose results cannot contain mempool sequence values.");
        }
        LOCK(pool.cs);
        UniValue o(UniValue::VOBJ);
        for (const CTxMemPoolEntry& e : pool.entryAll()) {
            UniValue info(UniValue::VOBJ);
            entryToJSON(pool, info, e);
            // Mempool has unique entries so there is no advantage in using
            // UniValue::pushKV, which checks if the key already exists in O(N).
            // UniValue::pushKVEnd is used instead which currently is O(1).
            o.pushKVEnd(e.GetTx().GetHash().ToString(), std::move(info));
        }
        return o;
    } else {
        UniValue a(UniValue::VARR);
        uint64_t mempool_sequence;
        {
            LOCK(pool.cs);
            for (const CTxMemPoolEntry& e : pool.entryAll()) {
                a.push_back(e.GetTx().GetHash().ToString());
            }
            mempool_sequence = pool.GetSequence();
        }
        if (!include_mempool_sequence) {
            return a;
        } else {
            UniValue o(UniValue::VOBJ);
            o.pushKV("txids", std::move(a));
            o.pushKV("mempool_sequence", mempool_sequence);
            return o;
        }
    }
}